

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O3

void __thiscall
pstack::Procman::Process::addElfObject(Process *this,string_view name,sptr *obj,Addr load)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  undefined1 local_180 [8];
  IOFlagSave _;
  MappedObject local_60;
  
  _._264_8_ = name._M_len;
  MappedObject::MappedObject(&local_60,name,obj);
  paVar1 = &local_60.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.name_._M_dataplus._M_p == paVar1) {
    _._24_8_ = local_60.name_.field_2._8_8_;
    _.target = (ios *)&_.field_0x10;
  }
  else {
    _.target = (ios *)local_60.name_._M_dataplus._M_p;
  }
  _._17_7_ = local_60.name_.field_2._M_allocated_capacity._1_7_;
  _._16_1_ = local_60.name_.field_2._M_local_buf[0];
  _._8_8_ = local_60.name_._M_string_length;
  local_60.name_._M_string_length = 0;
  local_60.name_.field_2._M_local_buf[0] = '\0';
  _._32_8_ = local_60.objptr_.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  _._40_8_ = local_60.objptr_.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  local_60.objptr_.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_60.objptr_.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_180 = (undefined1  [8])load;
  local_60.name_._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,pstack::Procman::MappedObject>,std::_Select1st<std::pair<unsigned_long_const,pstack::Procman::MappedObject>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Procman::MappedObject>>>
  ::_M_emplace_unique<std::pair<unsigned_long,pstack::Procman::MappedObject>>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,pstack::Procman::MappedObject>,std::_Select1st<std::pair<unsigned_long_const,pstack::Procman::MappedObject>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Procman::MappedObject>>>
              *)&this->objects,(pair<unsigned_long,_pstack::Procman::MappedObject> *)local_180);
  if (_._40_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_._40_8_);
  }
  if (_.target != (ios *)&_.field_0x10) {
    operator_delete(_.target,_._16_8_ + 1);
  }
  if (local_60.objptr_.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.objptr_.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.name_._M_dataplus._M_p,
                    CONCAT71(local_60.name_.field_2._M_allocated_capacity._1_7_,
                             local_60.name_.field_2._M_local_buf[0]) + 1);
  }
  if (1 < *(int *)(this->context + 0xa0)) {
    plVar2 = *(long **)(this->context + 0x78);
    IOFlagSave::IOFlagSave
              ((IOFlagSave *)local_180,(ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    poVar5 = *(ostream **)(this->context + 0x78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"object ",7);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,name._M_str,_._264_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," loaded at address ",0x13);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    lVar3 = *(long *)poVar5;
    lVar4 = *(long *)(lVar3 + -0x18);
    *(uint *)(poVar5 + lVar4 + 0x18) = *(uint *)(poVar5 + lVar4 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar3 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    IOFlagSave::~IOFlagSave((IOFlagSave *)local_180);
  }
  return;
}

Assistant:

void
Process::addElfObject(std::string_view name, const Elf::Object::sptr &obj, Elf::Addr load)
{
    objects.emplace(std::make_pair(load, MappedObject{ name, obj }));
    if (context.verbose >= 2) {
        IOFlagSave _(*context.debug);
        *context.debug << "object " << name << " loaded at address "
           << std::hex << load << std::dec << std::endl;
    }
}